

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O3

bool tinyusdz::operator==(Path *lhs,Path *rhs)

{
  int iVar1;
  bool bVar2;
  string local_58;
  string local_38;
  
  if ((lhs->_valid == true) && (rhs->_valid == true)) {
    Path::full_path_name_abi_cxx11_(&local_38,lhs);
    Path::full_path_name_abi_cxx11_(&local_58,rhs);
    if (local_38._M_string_length == local_58._M_string_length) {
      if (local_38._M_string_length == 0) {
        bVar2 = true;
      }
      else {
        iVar1 = bcmp(local_38._M_dataplus._M_p,local_58._M_dataplus._M_p,local_38._M_string_length);
        bVar2 = iVar1 == 0;
      }
    }
    else {
      bVar2 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator==(const Path &lhs, const Path &rhs) {
  if (!lhs.is_valid()) {
    return false;
  }

  if (!rhs.is_valid()) {
    return false;
  }

  // Currently simply compare string.
  // FIXME: Better Path identity check.
  return (lhs.full_path_name() == rhs.full_path_name());
}